

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned.hpp
# Opt level: O0

unsigned_long pstore::calc_alignment<unsigned_long>(unsigned_long v,size_t align)

{
  bool bVar1;
  unsigned_long local_20;
  size_t align_local;
  unsigned_long v_local;
  
  bVar1 = is_power_of_two<unsigned_long,std::enable_if<true,void>>(align);
  if (!bVar1) {
    assert_failed("is_power_of_two (align)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/aligned.hpp"
                  ,0x57);
  }
  if (align == 0) {
    local_20 = 0;
  }
  else {
    local_20 = ((v + align) - 1 & (align - 1 ^ 0xffffffffffffffff)) - v;
  }
  return local_20;
}

Assistant:

constexpr Ty calc_alignment (Ty const v, std::size_t const align) noexcept {
        PSTORE_ASSERT (is_power_of_two (align));
        return (align == 0U) ? 0U : ((v + align - 1U) & ~(align - 1U)) - v;
    }